

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O0

void __thiscall
duckdb::DuckSchemaEntry::DuckSchemaEntry
          (DuckSchemaEntry *this,Catalog *catalog,CreateSchemaInfo *info)

{
  DuckSchemaEntry *in_RSI;
  undefined8 *in_RDI;
  unique_ptr<duckdb::DefaultFunctionGenerator,_std::default_delete<duckdb::DefaultFunctionGenerator>_>
  *in_stack_fffffffffffffe88;
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
  *in_stack_fffffffffffffe90;
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true> *this_00
  ;
  Catalog *in_stack_fffffffffffffe98;
  Catalog *catalog_p;
  CatalogSet *in_stack_fffffffffffffea0;
  DuckSchemaEntry *in_stack_fffffffffffffeb0;
  DuckSchemaEntry *args_1;
  Catalog *in_stack_fffffffffffffeb8;
  Catalog *args;
  CreateSchemaInfo *in_stack_fffffffffffffed0;
  Catalog *in_stack_fffffffffffffed8;
  SchemaCatalogEntry *in_stack_fffffffffffffee0;
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true> local_88
  ;
  Catalog local_80;
  DuckSchemaEntry *local_10;
  
  local_10 = in_RSI;
  SchemaCatalogEntry::SchemaCatalogEntry
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  *in_RDI = &PTR__DuckSchemaEntry_0351ec88;
  make_uniq<duckdb::DefaultViewGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<duckdb::DefaultViewGenerator,std::default_delete<std::unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>>>,void>
            (in_stack_fffffffffffffe90,
             (unique_ptr<duckdb::DefaultViewGenerator,_std::default_delete<duckdb::DefaultViewGenerator>_>
              *)in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e2dd3);
  unique_ptr<duckdb::DefaultViewGenerator,_std::default_delete<duckdb::DefaultViewGenerator>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DefaultViewGenerator,_std::default_delete<duckdb::DefaultViewGenerator>,_true>
                 *)0x14e2de0);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<std::default_delete<duckdb::DefaultGenerator>,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e2e4b);
  make_uniq<duckdb::DefaultTableFunctionGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<duckdb::DefaultTableFunctionGenerator,std::default_delete<std::unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>>>,void>
            (in_stack_fffffffffffffe90,
             (unique_ptr<duckdb::DefaultTableFunctionGenerator,_std::default_delete<duckdb::DefaultTableFunctionGenerator>_>
              *)in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e2ecc);
  unique_ptr<duckdb::DefaultTableFunctionGenerator,_std::default_delete<duckdb::DefaultTableFunctionGenerator>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DefaultTableFunctionGenerator,_std::default_delete<duckdb::DefaultTableFunctionGenerator>,_true>
                 *)0x14e2ed9);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<std::default_delete<duckdb::DefaultGenerator>,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e2f44);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<std::default_delete<duckdb::DefaultGenerator>,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e2f9d);
  make_uniq<duckdb::DefaultFunctionGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<duckdb::DefaultFunctionGenerator,std::default_delete<std::unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>>>,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e300c);
  unique_ptr<duckdb::DefaultFunctionGenerator,_std::default_delete<duckdb::DefaultFunctionGenerator>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DefaultFunctionGenerator,_std::default_delete<duckdb::DefaultFunctionGenerator>,_true>
                 *)0x14e3019);
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<std::default_delete<duckdb::DefaultGenerator>,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e3072);
  args = &local_80;
  args_1 = local_10;
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<std::default_delete<duckdb::DefaultGenerator>,void>
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e30cb);
  catalog_p = (Catalog *)(in_RDI + 0x84);
  make_uniq<duckdb::DefaultTypeGenerator,duckdb::Catalog&,duckdb::DuckSchemaEntry&>(args,args_1);
  this_00 = &local_88;
  unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>,true>::
  unique_ptr<duckdb::DefaultTypeGenerator,std::default_delete<std::unique_ptr<duckdb::DefaultGenerator,std::default_delete<duckdb::DefaultGenerator>>>,void>
            (this_00,(unique_ptr<duckdb::DefaultTypeGenerator,_std::default_delete<duckdb::DefaultTypeGenerator>_>
                      *)in_stack_fffffffffffffe88);
  CatalogSet::CatalogSet((CatalogSet *)local_10,catalog_p,this_00);
  unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>::
  ~unique_ptr((unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
               *)0x14e313a);
  unique_ptr<duckdb::DefaultTypeGenerator,_std::default_delete<duckdb::DefaultTypeGenerator>,_true>
  ::~unique_ptr((unique_ptr<duckdb::DefaultTypeGenerator,_std::default_delete<duckdb::DefaultTypeGenerator>,_true>
                 *)0x14e3147);
  return;
}

Assistant:

DuckSchemaEntry::DuckSchemaEntry(Catalog &catalog, CreateSchemaInfo &info)
    : SchemaCatalogEntry(catalog, info), tables(catalog, make_uniq<DefaultViewGenerator>(catalog, *this)),
      indexes(catalog), table_functions(catalog, make_uniq<DefaultTableFunctionGenerator>(catalog, *this)),
      copy_functions(catalog), pragma_functions(catalog),
      functions(catalog, make_uniq<DefaultFunctionGenerator>(catalog, *this)), sequences(catalog), collations(catalog),
      types(catalog, make_uniq<DefaultTypeGenerator>(catalog, *this)) {
}